

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ftp.c
# Opt level: O1

CURLcode ftp_state_size_resp(Curl_easy *data,int ftpcode,ftpstate instate)

{
  int iVar1;
  CURLcode CVar2;
  byte *pbVar3;
  byte *__s;
  byte *pbVar4;
  curl_off_t filesize;
  char clbuf [128];
  curl_off_t local_b0;
  char local_a8 [136];
  
  local_b0 = -1;
  if (ftpcode == 0xd5) {
    __s = (byte *)((data->state).buffer + 4);
    pbVar3 = (byte *)strchr((char *)__s,0xd);
    if (pbVar3 != (byte *)0x0) {
      do {
        pbVar4 = pbVar3;
        pbVar3 = pbVar4 + -1;
        iVar1 = Curl_isdigit((uint)pbVar4[-1]);
        if (pbVar3 <= __s) break;
      } while (iVar1 != 0);
      iVar1 = Curl_isdigit((uint)*pbVar3);
      __s = pbVar4;
      if (iVar1 != 0) {
        __s = pbVar3;
      }
    }
    curlx_strtoofft((char *)__s,(char **)0x0,0,&local_b0);
  }
  else if (instate != FTP_STOR_SIZE && ftpcode == 0x226) {
    Curl_failf(data,"The file does not exist");
    return CURLE_REMOTE_FILE_NOT_FOUND;
  }
  if (instate == FTP_STOR_SIZE) {
    (data->state).resume_from = local_b0;
    CVar2 = ftp_state_ul_setup(data,true);
  }
  else if (instate == FTP_RETR_SIZE) {
    Curl_pgrsSetDownloadSize(data,local_b0);
    CVar2 = ftp_state_retr(data,local_b0);
  }
  else {
    CVar2 = CURLE_OK;
    if (instate == FTP_SIZE) {
      if (local_b0 != -1) {
        iVar1 = curl_msnprintf(local_a8,0x80,"Content-Length: %ld\r\n");
        CVar2 = Curl_client_write(data,3,local_a8,(long)iVar1);
        if (CVar2 != CURLE_OK) {
          return CVar2;
        }
      }
      Curl_pgrsSetDownloadSize(data,local_b0);
      CVar2 = ftp_state_rest(data,data->conn);
    }
  }
  return CVar2;
}

Assistant:

static CURLcode ftp_state_size_resp(struct Curl_easy *data,
                                    int ftpcode,
                                    ftpstate instate)
{
  CURLcode result = CURLE_OK;
  curl_off_t filesize = -1;
  char *buf = data->state.buffer;

  /* get the size from the ascii string: */
  if(ftpcode == 213) {
    /* To allow servers to prepend "rubbish" in the response string, we scan
       for all the digits at the end of the response and parse only those as a
       number. */
    char *start = &buf[4];
    char *fdigit = strchr(start, '\r');
    if(fdigit) {
      do
        fdigit--;
      while(ISDIGIT(*fdigit) && (fdigit > start));
      if(!ISDIGIT(*fdigit))
        fdigit++;
    }
    else
      fdigit = start;
    /* ignores parsing errors, which will make the size remain unknown */
    (void)curlx_strtoofft(fdigit, NULL, 0, &filesize);

  }
  else if(ftpcode == 550) { /* "No such file or directory" */
    /* allow a SIZE failure for (resumed) uploads, when probing what command
       to use */
    if(instate != FTP_STOR_SIZE) {
      failf(data, "The file does not exist");
      return CURLE_REMOTE_FILE_NOT_FOUND;
    }
  }

  if(instate == FTP_SIZE) {
#ifdef CURL_FTP_HTTPSTYLE_HEAD
    if(-1 != filesize) {
      char clbuf[128];
      int clbuflen = msnprintf(clbuf, sizeof(clbuf),
                "Content-Length: %" CURL_FORMAT_CURL_OFF_T "\r\n", filesize);
      result = Curl_client_write(data, CLIENTWRITE_BOTH, clbuf, clbuflen);
      if(result)
        return result;
    }
#endif
    Curl_pgrsSetDownloadSize(data, filesize);
    result = ftp_state_rest(data, data->conn);
  }
  else if(instate == FTP_RETR_SIZE) {
    Curl_pgrsSetDownloadSize(data, filesize);
    result = ftp_state_retr(data, filesize);
  }
  else if(instate == FTP_STOR_SIZE) {
    data->state.resume_from = filesize;
    result = ftp_state_ul_setup(data, TRUE);
  }

  return result;
}